

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadEXRMultipartImageFromMemory
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar *memory,size_t size
              ,char **err)

{
  EXRHeader *exr_header;
  long *plVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pvVar4;
  long lVar5;
  OffsetData *pOVar6;
  pointer pOVar7;
  bool bVar8;
  int iVar9;
  OffsetData *pOVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  OffsetData *__n;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  ulong *puVar19;
  int local_d0;
  allocator local_c9;
  OffsetData *local_c8;
  char **local_c0;
  string e;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> chunk_offset_table_list;
  vector<int,_std::allocator<int>_> num_x_tiles;
  vector<int,_std::allocator<int>_> num_y_tiles;
  
  local_d0 = -3;
  if (size < 9 ||
      ((memory == (uchar *)0x0 || num_parts == 0) ||
      (exr_headers == (EXRHeader **)0x0 || exr_images == (EXRImage *)0x0))) {
    std::__cxx11::string::string
              ((string *)&e,"Invalid argument for LoadEXRMultipartImageFromMemory()",
               (allocator *)&chunk_offset_table_list);
    tinyexr::SetErrorMessage(&e,err);
    std::__cxx11::string::~string((string *)&e);
  }
  else {
    __n = (OffsetData *)(ulong)num_parts;
    lVar12 = 0;
    for (pOVar10 = (OffsetData *)0x0; __n != pOVar10;
        pOVar10 = (OffsetData *)
                  ((long)&(pOVar10->offsets).
                          super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1)) {
      if ((ulong)exr_headers[(long)pOVar10]->header_len == 0) {
        std::__cxx11::string::string
                  ((string *)&e,"EXRHeader variable is not initialized.",
                   (allocator *)&chunk_offset_table_list);
        tinyexr::SetErrorMessage(&e,err);
        std::__cxx11::string::~string((string *)&e);
        return -3;
      }
      lVar12 = lVar12 + (ulong)exr_headers[(long)pOVar10]->header_len;
    }
    chunk_offset_table_list.
    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    chunk_offset_table_list.
    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    chunk_offset_table_list.
    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c0 = err;
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::reserve
              (&chunk_offset_table_list,(size_type)__n);
    puVar19 = (ulong *)(memory + lVar12 + 9);
    local_d0 = -3;
    pOVar10 = (OffsetData *)0x0;
    while (pOVar10 != __n) {
      local_c8 = pOVar10;
      std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::resize
                (&chunk_offset_table_list,
                 ((long)chunk_offset_table_list.
                        super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)chunk_offset_table_list.
                        super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
      pOVar7 = chunk_offset_table_list.
               super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pOVar10 = chunk_offset_table_list.
                super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                _M_impl.super__Vector_impl_data._M_finish + -1;
      exr_header = exr_headers[(long)local_c8];
      if ((exr_header->tiled == 0) || (exr_header->tile_level_mode == 0)) {
        tinyexr::InitSingleResolutionOffsets(pOVar10,(long)exr_header->chunk_count);
        pOVar6 = local_c8;
        plVar1 = *(long **)&(((pOVar10->offsets).
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            )._M_impl;
        lVar12 = *plVar1;
        lVar5 = plVar1[1];
        lVar13 = 0;
LAB_00109df8:
        if (lVar5 - lVar12 >> 3 != lVar13) {
          if (*puVar19 < size) goto code_r0x00109e0e;
          std::__cxx11::string::string
                    ((string *)&e,"Invalid offset size in EXR header chunks.",
                     (allocator *)&num_x_tiles);
LAB_00109f7f:
          bVar8 = pOVar6 < __n;
          tinyexr::SetErrorMessage(&e,local_c0);
          std::__cxx11::string::~string((string *)&e);
          local_d0 = -4;
          goto LAB_00109fa4;
        }
        goto LAB_00109f0d;
      }
      num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      bVar8 = tinyexr::PrecalculateTileInfo(&num_x_tiles,&num_y_tiles,exr_header);
      if (bVar8) {
        iVar9 = tinyexr::InitTileOffsets
                          (pOVar10,exr_headers[(long)local_c8],&num_x_tiles,&num_y_tiles);
        bVar8 = true;
        if (iVar9 != exr_headers[(long)local_c8]->chunk_count) {
          std::__cxx11::string::string((string *)&e,"Invalid offset table size.",&local_c9);
          goto LAB_00109e38;
        }
      }
      else {
        std::__cxx11::string::string((string *)&e,"Invalid tile info.",&local_c9);
LAB_00109e38:
        tinyexr::SetErrorMessage(&e,local_c0);
        std::__cxx11::string::~string((string *)&e);
        bVar8 = false;
        local_d0 = -4;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&num_y_tiles.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&num_x_tiles.super__Vector_base<int,_std::allocator<int>_>);
      if (!bVar8) goto LAB_0010a0f6;
      pvVar2 = pOVar7[-1].offsets.
               super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = pOVar7[-1].offsets.
               super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (uVar16 = 0; uVar15 = (ulong)uVar16,
          uVar15 < (ulong)(((long)pvVar3 - (long)pvVar2) / 0x18); uVar16 = uVar16 + 1) {
        pvVar4 = *(pointer *)
                  ((long)&pvVar2[uVar15].
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl + 8);
        lVar12 = *(long *)&pvVar2[uVar15].
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl;
        for (uVar11 = 0; (ulong)uVar11 < (ulong)(((long)pvVar4 - lVar12) / 0x18);
            uVar11 = uVar11 + 1) {
          lVar5 = *(long *)&pvVar2[uVar15].
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl;
          lVar18 = (ulong)uVar11 * 0x18;
          lVar13 = *(long *)(lVar5 + lVar18);
          lVar5 = *(long *)(lVar5 + 8 + lVar18);
          for (uVar17 = 0; (ulong)uVar17 < (ulong)(lVar5 - lVar13 >> 3); uVar17 = uVar17 + 1) {
            if (size <= *puVar19) {
              std::__cxx11::string::string
                        ((string *)&e,"Invalid offset size in EXR header chunks.",
                         (allocator *)&num_x_tiles);
              pOVar6 = local_c8;
              goto LAB_00109f7f;
            }
            *(ulong *)(lVar13 + (ulong)uVar17 * 8) = *puVar19 + 4;
            puVar19 = puVar19 + 1;
          }
        }
      }
LAB_00109f0d:
      pOVar10 = (OffsetData *)
                ((long)&(local_c8->offsets).
                        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    bVar8 = false;
LAB_00109fa4:
    if (!bVar8) {
      pOVar10 = (OffsetData *)0x0;
      do {
        if (pOVar10 == __n) {
          local_d0 = 0;
          break;
        }
        local_c8 = chunk_offset_table_list.
                   super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                   _M_impl.super__Vector_impl_data._M_start + (long)pOVar10;
        pvVar2 = chunk_offset_table_list.
                 super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                 _M_impl.super__Vector_impl_data._M_start[(long)pOVar10].offsets.
                 super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (uVar16 = 0; uVar15 = (ulong)uVar16,
            uVar15 < (ulong)(((long)chunk_offset_table_list.
                                    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(long)pOVar10].offsets
                                    .
                                    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) /
                            0x18); uVar16 = uVar16 + 1) {
          for (uVar11 = 0;
              (ulong)uVar11 <
              (ulong)(((long)*(pointer *)
                              ((long)&pvVar2[uVar15].
                                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl + 8) -
                      *(long *)&pvVar2[uVar15].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl) / 0x18); uVar11 = uVar11 + 1) {
            lVar12 = *(long *)&pvVar2[uVar15].
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl;
            lVar13 = (ulong)uVar11 * 0x18;
            lVar5 = *(long *)(lVar12 + lVar13);
            uVar17 = 0;
            while (uVar14 = (ulong)uVar17,
                  uVar14 < (ulong)(*(long *)(lVar12 + 8 + lVar13) - lVar5 >> 3)) {
              uVar17 = uVar17 + 1;
              if (pOVar10 !=
                  (OffsetData *)(ulong)*(uint *)(memory + *(long *)(lVar5 + uVar14 * 8) + -4)) {
                std::__cxx11::string::string
                          ((string *)&e,"Invalid `part number\' in EXR header chunks.",
                           (allocator *)&num_x_tiles);
                tinyexr::SetErrorMessage(&e,local_c0);
                std::__cxx11::string::~string((string *)&e);
                local_d0 = -4;
                goto LAB_0010a0f6;
              }
            }
          }
        }
        e._M_dataplus._M_p = (pointer)&e.field_2;
        e._M_string_length = 0;
        e.field_2._M_local_buf[0] = '\0';
        iVar9 = tinyexr::DecodeChunk
                          (exr_images + (long)pOVar10,exr_headers[(long)pOVar10],local_c8,memory,
                           size,&e);
        if ((iVar9 != 0) && (local_d0 = iVar9, e._M_string_length != 0)) {
          tinyexr::SetErrorMessage(&e,local_c0);
        }
        std::__cxx11::string::~string((string *)&e);
        pOVar10 = (OffsetData *)
                  ((long)&(pOVar10->offsets).
                          super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
      } while (iVar9 == 0);
    }
LAB_0010a0f6:
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::~vector
              (&chunk_offset_table_list);
  }
  return local_d0;
code_r0x00109e0e:
  *(ulong *)(lVar12 + lVar13 * 8) = *puVar19 + 4;
  puVar19 = puVar19 + 1;
  lVar13 = lVar13 + 1;
  goto LAB_00109df8;
}

Assistant:

int LoadEXRMultipartImageFromMemory(EXRImage *exr_images,
                                    const EXRHeader **exr_headers,
                                    unsigned int num_parts,
                                    const unsigned char *memory,
                                    const size_t size, const char **err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory == NULL || (size <= tinyexr::kEXRVersionSize)) {
    tinyexr::SetErrorMessage(
        "Invalid argument for LoadEXRMultipartImageFromMemory()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  // compute total header size.
  size_t total_header_size = 0;
  for (unsigned int i = 0; i < num_parts; i++) {
    if (exr_headers[i]->header_len == 0) {
      tinyexr::SetErrorMessage("EXRHeader variable is not initialized.", err);
      return TINYEXR_ERROR_INVALID_ARGUMENT;
    }

    total_header_size += exr_headers[i]->header_len;
  }

  const char *marker = reinterpret_cast<const char *>(
      memory + total_header_size + 4 +
      4);  // +8 for magic number and version header.

  marker += 1;  // Skip empty header.

  // NOTE 1:
  //   In multipart image, There is 'part number' before chunk data.
  //   4 byte : part number
  //   4+     : chunk
  //
  // NOTE 2:
  //   EXR spec says 'part number' is 'unsigned long' but actually this is
  //   'unsigned int(4 bytes)' in OpenEXR implementation...
  //   http://www.openexr.com/openexrfilelayout.pdf

  // Load chunk offset table.
  std::vector<tinyexr::OffsetData> chunk_offset_table_list;
  chunk_offset_table_list.reserve(num_parts);
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    chunk_offset_table_list.resize(chunk_offset_table_list.size() + 1);
    tinyexr::OffsetData& offset_data = chunk_offset_table_list.back();
    if (!exr_headers[i]->tiled || exr_headers[i]->tile_level_mode == TINYEXR_TILE_ONE_LEVEL) {
      tinyexr::InitSingleResolutionOffsets(offset_data, size_t(exr_headers[i]->chunk_count));
      std::vector<tinyexr::tinyexr_uint64>& offset_table = offset_data.offsets[0][0];

      for (size_t c = 0; c < offset_table.size(); c++) {
        tinyexr::tinyexr_uint64 offset;
        memcpy(&offset, marker, 8);
        tinyexr::swap8(&offset);

        if (offset >= size) {
          tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                                   err);
          return TINYEXR_ERROR_INVALID_DATA;
        }

        offset_table[c] = offset + 4;  // +4 to skip 'part number'
        marker += 8;
      }
    } else {
      {
        std::vector<int> num_x_tiles, num_y_tiles;
        if (!tinyexr::PrecalculateTileInfo(num_x_tiles, num_y_tiles, exr_headers[i])) {
          tinyexr::SetErrorMessage("Invalid tile info.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
        int num_blocks = InitTileOffsets(offset_data, exr_headers[i], num_x_tiles, num_y_tiles);
        if (num_blocks != exr_headers[i]->chunk_count) {
          tinyexr::SetErrorMessage("Invalid offset table size.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
      }
      for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
        for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
          for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {
            tinyexr::tinyexr_uint64 offset;
            memcpy(&offset, marker, sizeof(tinyexr::tinyexr_uint64));
            tinyexr::swap8(&offset);
            if (offset >= size) {
              tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                err);
              return TINYEXR_ERROR_INVALID_DATA;
            }
            offset_data.offsets[l][dy][dx] = offset + 4; // +4 to skip 'part number'
            marker += sizeof(tinyexr::tinyexr_uint64);  // = 8
          }
        }
      }
    }
  }

  // Decode image.
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    tinyexr::OffsetData &offset_data = chunk_offset_table_list[i];

    // First check 'part number' is identical to 'i'
    for (unsigned int l = 0; l < offset_data.offsets.size(); ++l)
      for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy)
        for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {

          const unsigned char *part_number_addr =
              memory + offset_data.offsets[l][dy][dx] - 4;  // -4 to move to 'part number' field.
          unsigned int part_no;
          memcpy(&part_no, part_number_addr, sizeof(unsigned int));  // 4
          tinyexr::swap4(&part_no);

          if (part_no != i) {
            tinyexr::SetErrorMessage("Invalid `part number' in EXR header chunks.",
                                     err);
            return TINYEXR_ERROR_INVALID_DATA;
          }
        }

    std::string e;
    int ret = tinyexr::DecodeChunk(&exr_images[i], exr_headers[i], offset_data,
                                   memory, size, &e);
    if (ret != TINYEXR_SUCCESS) {
      if (!e.empty()) {
        tinyexr::SetErrorMessage(e, err);
      }
      return ret;
    }
  }

  return TINYEXR_SUCCESS;
}